

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
tcb::unicode::
to_utf_string<char16_t,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,char32_t>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,unicode *this,
          __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          first,__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                last)

{
  size_type __res;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  out;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  last_local;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  first_local;
  string_type *output;
  
  std::__cxx11::u16string::u16string((u16string *)__return_storage_ptr__);
  __res = std::distance<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
                    ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                      )this,first);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  reserve(__return_storage_ptr__,__res);
  out = std::back_inserter<std::__cxx11::u16string>(__return_storage_ptr__);
  utf_convert<char16_t,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,std::back_insert_iterator<std::__cxx11::u16string>,char32_t>
            ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )this,first,out);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}